

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Requantize_x86_avx::forward
          (Requantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _elempack;
  int iVar1;
  uint _h;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  int *piVar10;
  int *piVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int _w;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Option *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  Mat *local_60;
  Mat *local_58;
  Mat *local_50;
  Mat *local_48;
  Mat *local_40;
  Mat *local_38;
  
  _elempack = bottom_blob->elempack;
  uVar14 = (ulong)_elempack;
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  local_78 = (ulong)(uint)bottom_blob->c;
  sVar12 = (size_t)(int)_elempack;
  if (iVar1 == 3) {
    Mat::create(top_blob,_w,_h,bottom_blob->c,uVar14,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)local_78 < 1) {
      return 0;
    }
    lVar13 = 0;
    uVar14 = 0;
    do {
      sVar3 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      pvVar5 = bottom_blob->data;
      sVar6 = top_blob->cstep;
      sVar7 = top_blob->elemsize;
      pvVar8 = top_blob->data;
      if ((this->super_Requantize).scale_in_data_size < 2) {
        piVar10 = (this->super_Requantize).scale_in_data.refcount;
        local_c8.data = (this->super_Requantize).scale_in_data.data;
        piVar11 = (this->super_Requantize).scale_in_data.refcount;
        local_c8.refcount._0_4_ = SUB84(piVar11,0);
        local_c8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
        sVar9 = (this->super_Requantize).scale_in_data.elemsize;
        local_c8.elemsize._0_4_ = (undefined4)sVar9;
        local_c8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_c8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_c8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_c8.dims = (this->super_Requantize).scale_in_data.dims;
        local_c8.w = (this->super_Requantize).scale_in_data.w;
        local_c8.h = (this->super_Requantize).scale_in_data.h;
        local_c8.d = (this->super_Requantize).scale_in_data.d;
        local_c8.c = (this->super_Requantize).scale_in_data.c;
        local_c8.cstep = (this->super_Requantize).scale_in_data.cstep;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
      }
      else {
        sVar9 = (this->super_Requantize).scale_in_data.elemsize;
        local_c8.data = (void *)(sVar9 * lVar13 + (long)(this->super_Requantize).scale_in_data.data)
        ;
        local_c8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_c8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = (undefined4)sVar9;
        local_c8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_c8.w = _elempack;
        local_c8.dims = 1;
        local_c8.h = 1;
        local_c8.d = 1;
        local_c8.c = 1;
        local_c8.cstep = sVar12;
      }
      if ((this->super_Requantize).bias_data_size < 2) {
        piVar10 = (this->super_Requantize).bias_data.refcount;
        local_118.data = (this->super_Requantize).bias_data.data;
        piVar11 = (this->super_Requantize).bias_data.refcount;
        local_118.refcount._0_4_ = SUB84(piVar11,0);
        local_118.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
        sVar9 = (this->super_Requantize).bias_data.elemsize;
        local_118.elemsize._0_4_ = (undefined4)sVar9;
        local_118.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_118.elempack = (this->super_Requantize).bias_data.elempack;
        local_118.allocator = (this->super_Requantize).bias_data.allocator;
        local_118.dims = (this->super_Requantize).bias_data.dims;
        local_118.w = (this->super_Requantize).bias_data.w;
        local_118.h = (this->super_Requantize).bias_data.h;
        local_118.d = (this->super_Requantize).bias_data.d;
        local_118.c = (this->super_Requantize).bias_data.c;
        local_118.cstep = (this->super_Requantize).bias_data.cstep;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
      }
      else {
        sVar9 = (this->super_Requantize).bias_data.elemsize;
        local_118.data = (void *)(sVar9 * lVar13 + (long)(this->super_Requantize).bias_data.data);
        local_118.elempack = (this->super_Requantize).bias_data.elempack;
        local_118.allocator = (this->super_Requantize).bias_data.allocator;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = (undefined4)sVar9;
        local_118.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_118.w = _elempack;
        local_118.dims = 1;
        local_118.h = 1;
        local_118.d = 1;
        local_118.c = 1;
        local_118.cstep = sVar12;
      }
      if ((this->super_Requantize).scale_out_data_size < 2) {
        piVar10 = (this->super_Requantize).scale_out_data.refcount;
        local_168.data = (this->super_Requantize).scale_out_data.data;
        piVar11 = (this->super_Requantize).scale_out_data.refcount;
        local_168.refcount._0_4_ = SUB84(piVar11,0);
        local_168.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
        sVar9 = (this->super_Requantize).scale_out_data.elemsize;
        local_168.elemsize._0_4_ = (undefined4)sVar9;
        local_168.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_168.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_168.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_168.dims = (this->super_Requantize).scale_out_data.dims;
        local_168.w = (this->super_Requantize).scale_out_data.w;
        local_168.h = (this->super_Requantize).scale_out_data.h;
        local_168.d = (this->super_Requantize).scale_out_data.d;
        local_168.c = (this->super_Requantize).scale_out_data.c;
        local_168.cstep = (this->super_Requantize).scale_out_data.cstep;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
      }
      else {
        sVar9 = (this->super_Requantize).scale_out_data.elemsize;
        local_168.data =
             (void *)(sVar9 * lVar13 + (long)(this->super_Requantize).scale_out_data.data);
        local_168.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_168.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = (undefined4)sVar9;
        local_168.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
        local_168.w = _elempack;
        local_168.dims = 1;
        local_168.h = 1;
        local_168.d = 1;
        local_168.c = 1;
        local_168.cstep = sVar12;
      }
      requantize((int *)(sVar3 * uVar14 * sVar4 + (long)pvVar5),
                 (char *)(sVar6 * uVar14 * sVar7 + (long)pvVar8),&local_c8,&local_118,&local_168,
                 (this->super_Requantize).activation_type,
                 &(this->super_Requantize).activation_params,_h * _w,_elempack);
      piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + sVar12;
    } while (local_78 != uVar14);
  }
  else {
    local_80 = opt;
    if (iVar1 == 2) {
      Mat::create(top_blob,_w,_h,uVar14,_elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (0 < (int)_h) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          iVar1 = bottom_blob->w;
          sVar3 = bottom_blob->elemsize;
          pvVar5 = bottom_blob->data;
          iVar2 = top_blob->w;
          sVar4 = top_blob->elemsize;
          pvVar8 = top_blob->data;
          if ((this->super_Requantize).scale_in_data_size < 2) {
            piVar10 = (this->super_Requantize).scale_in_data.refcount;
            local_c8.data = (this->super_Requantize).scale_in_data.data;
            piVar11 = (this->super_Requantize).scale_in_data.refcount;
            local_c8.refcount._0_4_ = SUB84(piVar11,0);
            local_c8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar6 = (this->super_Requantize).scale_in_data.elemsize;
            local_c8.elemsize._0_4_ = (undefined4)sVar6;
            local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_c8.elempack = (this->super_Requantize).scale_in_data.elempack;
            local_c8.allocator = (this->super_Requantize).scale_in_data.allocator;
            local_c8.dims = (this->super_Requantize).scale_in_data.dims;
            local_c8.w = (this->super_Requantize).scale_in_data.w;
            local_c8.h = (this->super_Requantize).scale_in_data.h;
            local_c8.d = (this->super_Requantize).scale_in_data.d;
            local_c8.c = (this->super_Requantize).scale_in_data.c;
            local_c8.cstep = (this->super_Requantize).scale_in_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar6 = (this->super_Requantize).scale_in_data.elemsize;
            local_c8.data =
                 (void *)(sVar6 * lVar13 + (long)(this->super_Requantize).scale_in_data.data);
            local_c8.elempack = (this->super_Requantize).scale_in_data.elempack;
            local_c8.allocator = (this->super_Requantize).scale_in_data.allocator;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = (undefined4)sVar6;
            local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_c8.w = _elempack;
            local_c8.dims = 1;
            local_c8.h = 1;
            local_c8.d = 1;
            local_c8.c = 1;
            local_c8.cstep = sVar12;
          }
          if ((this->super_Requantize).bias_data_size < 2) {
            piVar10 = (this->super_Requantize).bias_data.refcount;
            local_118.data = (this->super_Requantize).bias_data.data;
            piVar11 = (this->super_Requantize).bias_data.refcount;
            local_118.refcount._0_4_ = SUB84(piVar11,0);
            local_118.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar6 = (this->super_Requantize).bias_data.elemsize;
            local_118.elemsize._0_4_ = (undefined4)sVar6;
            local_118.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_118.elempack = (this->super_Requantize).bias_data.elempack;
            local_118.allocator = (this->super_Requantize).bias_data.allocator;
            local_118.dims = (this->super_Requantize).bias_data.dims;
            local_118.w = (this->super_Requantize).bias_data.w;
            local_118.h = (this->super_Requantize).bias_data.h;
            local_118.d = (this->super_Requantize).bias_data.d;
            local_118.c = (this->super_Requantize).bias_data.c;
            local_118.cstep = (this->super_Requantize).bias_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar6 = (this->super_Requantize).bias_data.elemsize;
            local_118.data =
                 (void *)(sVar6 * lVar13 + (long)(this->super_Requantize).bias_data.data);
            local_118.elempack = (this->super_Requantize).bias_data.elempack;
            local_118.allocator = (this->super_Requantize).bias_data.allocator;
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (undefined4)sVar6;
            local_118.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_118.w = _elempack;
            local_118.dims = 1;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_118.cstep = sVar12;
          }
          if ((this->super_Requantize).scale_out_data_size < 2) {
            piVar10 = (this->super_Requantize).scale_out_data.refcount;
            local_168.data = (this->super_Requantize).scale_out_data.data;
            piVar11 = (this->super_Requantize).scale_out_data.refcount;
            local_168.refcount._0_4_ = SUB84(piVar11,0);
            local_168.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar6 = (this->super_Requantize).scale_out_data.elemsize;
            local_168.elemsize._0_4_ = (undefined4)sVar6;
            local_168.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_168.elempack = (this->super_Requantize).scale_out_data.elempack;
            local_168.allocator = (this->super_Requantize).scale_out_data.allocator;
            local_168.dims = (this->super_Requantize).scale_out_data.dims;
            local_168.w = (this->super_Requantize).scale_out_data.w;
            local_168.h = (this->super_Requantize).scale_out_data.h;
            local_168.d = (this->super_Requantize).scale_out_data.d;
            local_168.c = (this->super_Requantize).scale_out_data.c;
            local_168.cstep = (this->super_Requantize).scale_out_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar6 = (this->super_Requantize).scale_out_data.elemsize;
            local_168.data =
                 (void *)(sVar6 * lVar13 + (long)(this->super_Requantize).scale_out_data.data);
            local_168.elempack = (this->super_Requantize).scale_out_data.elempack;
            local_168.allocator = (this->super_Requantize).scale_out_data.allocator;
            local_168.refcount._0_4_ = 0;
            local_168.refcount._4_4_ = 0;
            local_168.elemsize._0_4_ = (undefined4)sVar6;
            local_168.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_168.w = _elempack;
            local_168.dims = 1;
            local_168.h = 1;
            local_168.d = 1;
            local_168.c = 1;
            local_168.cstep = sVar12;
          }
          requantize((int *)((long)iVar1 * uVar14 * sVar3 + (long)pvVar5),
                     (char *)((long)iVar2 * uVar14 * sVar4 + (long)pvVar8),&local_c8,&local_118,
                     &local_168,(this->super_Requantize).activation_type,
                     &(this->super_Requantize).activation_params,_w,_elempack);
          piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118.elemsize._4_4_ = 0;
          local_118.elempack = 0;
          local_118.dims = 0;
          local_118.w = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + sVar12;
        } while (_h != uVar14);
      }
    }
    else if (iVar1 == 1) {
      Mat::create(top_blob,_w,uVar14,_elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      uVar14 = (long)_w / (long)opt->num_threads;
      uVar15 = 1;
      if (1 < (int)uVar14) {
        uVar15 = uVar14 & 0xffffffff;
      }
      iVar1 = (int)uVar15;
      uVar14 = (long)(_w + iVar1 + -1) / (long)iVar1;
      if (0 < (int)uVar14) {
        local_48 = &(this->super_Requantize).scale_in_data;
        local_50 = &(this->super_Requantize).bias_data;
        local_58 = &(this->super_Requantize).scale_out_data;
        local_60 = &(this->super_Requantize).activation_params;
        uVar14 = uVar14 & 0xffffffff;
        local_68 = uVar15 * sVar12;
        local_70 = local_68 * 4;
        lVar13 = 0;
        lVar16 = 0;
        local_40 = bottom_blob;
        local_38 = top_blob;
        do {
          iVar2 = _w;
          if (iVar1 < _w) {
            iVar2 = iVar1;
          }
          _w = -(iVar1 - _w);
          requantize((int *)((long)local_40->data + lVar16),(char *)((long)local_38->data + lVar13),
                     local_48,local_50,local_58,(this->super_Requantize).activation_type,local_60,
                     iVar2 * _elempack,1);
          lVar16 = lVar16 + local_70;
          lVar13 = lVar13 + local_68;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
  }
  return 0;
}

Assistant:

int Requantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;
    const size_t out_elemsize = elempack * 1u;

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            signed char* ptr = (signed char*)top_blob + i * elempack;

            // assert scale_in_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1
            // assert scale_out_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            requantize(intptr, ptr, scale_in_data, bias_data, scale_out_data, activation_type, activation_params, size, 1);
        }
    }

    if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const Mat scale_in_data_i = scale_in_data_size > 1 ? scale_in_data.range(i * elempack, elempack) : scale_in_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;
            const Mat scale_out_data_i = scale_out_data_size > 1 ? scale_out_data.range(i * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_i, bias_data_i, scale_out_data_i, activation_type, activation_params, w, elempack);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const Mat scale_in_data_q = scale_in_data_size > 1 ? scale_in_data.range(q * elempack, elempack) : scale_in_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;
            const Mat scale_out_data_q = scale_out_data_size > 1 ? scale_out_data.range(q * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_q, bias_data_q, scale_out_data_q, activation_type, activation_params, w * h, elempack);
        }
    }

    return 0;
}